

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

int err_unwind_jit(int version,int actions,uint64_t uexclass,_Unwind_Exception *uex,
                  _Unwind_Context *ctx)

{
  uint64_t uVar1;
  int iVar2;
  long lVar3;
  uintptr_t uVar4;
  ExitNo exitno;
  ExitNo local_1c;
  
  iVar2 = 3;
  if ((((uexclass ^ 0x4c55414a49543200) < 0x100 && version == 1) && (iVar2 = 6, (actions & 1U) == 0)
      ) && (iVar2 = 3, (actions & 2U) != 0)) {
    uVar1 = uex[1].exclass;
    lVar3 = _Unwind_GetIP(ctx);
    uVar4 = lj_trace_unwind((jit_State *)(uVar1 + 0x248),lVar3 - 1,&local_1c);
    if (uVar4 == 0) {
      iVar2 = 2;
    }
    else {
      *(uint *)(uVar1 + 0xbf8) = (uint)uexclass & 0xff;
      _Unwind_SetIP(ctx,uVar4);
      iVar2 = 7;
    }
  }
  return iVar2;
}

Assistant:

static int err_unwind_jit(int version, int actions,
  uint64_t uexclass, _Unwind_Exception *uex, _Unwind_Context *ctx)
{
  /* NYI: FFI C++ exception interoperability. */
  if (version != 1 || !LJ_UEXCLASS_CHECK(uexclass))
    return _URC_FATAL_PHASE1_ERROR;
  if ((actions & _UA_SEARCH_PHASE)) {
    return _URC_HANDLER_FOUND;
  }
  if ((actions & _UA_CLEANUP_PHASE)) {
    global_State *g = *(global_State **)(uex+1);
    ExitNo exitno;
    uintptr_t addr = _Unwind_GetIP(ctx);  /* Return address _after_ call. */
    uintptr_t stub = lj_trace_unwind(G2J(g), addr - sizeof(MCode), &exitno);
    lj_assertG(tvref(g->jit_base), "unexpected throw across mcode frame");
    if (stub) {  /* Jump to side exit to unwind the trace. */
      G2J(g)->exitcode = LJ_UEXCLASS_ERRCODE(uexclass);
#ifdef LJ_TARGET_MIPS
      _Unwind_SetGR(ctx, 4, stub);
      _Unwind_SetGR(ctx, 5, exitno);
      _Unwind_SetIP(ctx, (uintptr_t)(void *)lj_vm_unwind_stub);
#else
      _Unwind_SetIP(ctx, stub);
#endif
      return _URC_INSTALL_CONTEXT;
    }
    return _URC_FATAL_PHASE2_ERROR;
  }
  return _URC_FATAL_PHASE1_ERROR;
}